

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

SymOpnd * IR::SymOpnd::New(Sym *sym,uint32 offset,IRType type,Func *func)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JitArenaAllocator *alloc;
  SymOpnd *this_00;
  TrackAllocData local_50;
  SymOpnd *local_28;
  SymOpnd *symOpnd;
  Func *func_local;
  IRType type_local;
  Sym *pSStack_10;
  uint32 offset_local;
  Sym *sym_local;
  
  symOpnd = (SymOpnd *)func;
  func_local._3_1_ = type;
  func_local._4_4_ = offset;
  pSStack_10 = sym;
  if (sym == (Sym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
                       ,0x2a4,"(sym)","A SymOpnd needs a valid symbol.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this = (ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
         (symOpnd->super_Opnd)._vptr_Opnd;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.cpp"
             ,0x2a6);
  alloc = (JitArenaAllocator *)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::TrackAllocInfo
                    (this,&local_50);
  this_00 = (SymOpnd *)new<Memory::JitArenaAllocator>(0x20,alloc,0x4e98c0);
  memset(this_00,0,0x20);
  SymOpnd(this_00);
  this_00->m_sym = pSStack_10;
  this_00->m_offset = func_local._4_4_;
  (this_00->super_Opnd).m_type = func_local._3_1_;
  local_28 = this_00;
  Opnd::SetIsJITOptimizedReg((Opnd *)this_00,false);
  (local_28->super_Opnd).m_kind = OpndKindSym;
  return local_28;
}

Assistant:

SymOpnd *
SymOpnd::New(Sym *sym, uint32 offset, IRType type, Func *func)
{
    SymOpnd * symOpnd;

    AssertMsg(sym, "A SymOpnd needs a valid symbol.");

    symOpnd = JitAnew(func->m_alloc, IR::SymOpnd);

    symOpnd->m_sym = sym;
    symOpnd->m_offset = offset;
    symOpnd->m_type = type;
    symOpnd->SetIsJITOptimizedReg(false);


    symOpnd->m_kind = OpndKindSym;


    return symOpnd;
}